

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_conversions.hpp
# Opt level: O1

Type_Conversion
chaiscript::
vector_conversion<std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>>
          (void)

{
  Type_Conversion_Base *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Type_Conversion TVar1;
  
  __p = (Type_Conversion_Base *)operator_new(0x40);
  (__p->m_from).m_type_info =
       (type_info *)
       &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo;
  (__p->m_from).m_bare_type_info =
       (type_info *)
       &std::vector<chaiscript::Boxed_Value,std::allocator<chaiscript::Boxed_Value>>::typeinfo;
  (__p->m_from).m_flags = 0;
  (__p->m_to).m_type_info =
       (type_info *)
       &std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>::typeinfo;
  (__p->m_to).m_bare_type_info =
       (type_info *)
       &std::vector<Returned_Converted_Config,std::allocator<Returned_Converted_Config>>::typeinfo;
  (__p->m_to).m_flags = 0;
  __p->_vptr_Type_Conversion_Base = (_func_int **)&PTR_convert_005aa340;
  in_RDI->_vptr_Type_Conversion_Base = (_func_int **)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::detail::Type_Conversion_Base*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&in_RDI->m_to,__p);
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  TVar1.super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = in_RDI;
  return (Type_Conversion)
         TVar1.
         super___shared_ptr<chaiscript::detail::Type_Conversion_Base,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Type_Conversion vector_conversion() {
    auto func = [](const Boxed_Value &t_bv) -> Boxed_Value {
      const std::vector<Boxed_Value> &from_vec = detail::Cast_Helper<const std::vector<Boxed_Value> &>::cast(t_bv, nullptr);

      To vec;
      vec.reserve(from_vec.size());
      for (const Boxed_Value &bv : from_vec) {
        vec.push_back(detail::Cast_Helper<typename To::value_type>::cast(bv, nullptr));
      }

      return Boxed_Value(std::move(vec));
    };

    return chaiscript::make_shared<detail::Type_Conversion_Base, detail::Type_Conversion_Impl<decltype(func)>>(user_type<std::vector<Boxed_Value>>(),
                                                                                                               user_type<To>(),
                                                                                                               func);
  }